

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlParserNsPush(xmlParserCtxtPtr ctxt,xmlHashedString *prefix,xmlHashedString *uri,void *saxData
                   ,int defAttr)

{
  uint *puVar1;
  xmlParserNsBucket *pxVar2;
  uint uVar3;
  xmlParserNsBucket *__s;
  xmlChar **ppxVar4;
  xmlParserNsExtra *pxVar5;
  uint uVar6;
  xmlParserNsData *pxVar7;
  ulong uVar8;
  uint uVar9;
  xmlChar *pxVar10;
  int iVar11;
  char *msg;
  xmlParserNsBucket *bucket;
  xmlHashedString *local_48;
  uint local_3c;
  size_t local_38;
  
  bucket = (xmlParserNsBucket *)0x0;
  if ((prefix != (xmlHashedString *)0x0) && (prefix->name == ctxt->str_xml)) {
    return 0;
  }
  iVar11 = ctxt->nsMax;
  if (iVar11 <= ctxt->nsNr) {
    if (iVar11 < 1) {
      uVar8 = 0x10;
    }
    else {
      uVar8 = 0xffffffff;
      if (iVar11 < 1000000000) {
        uVar9 = iVar11 + 1U >> 1;
        uVar3 = uVar9 + iVar11;
        if ((int)(1000000000 - uVar9) < iVar11) {
          uVar3 = 1000000000;
        }
        uVar8 = (ulong)uVar3;
      }
    }
    iVar11 = (int)uVar8;
    local_48 = uri;
    if ((-1 < iVar11) &&
       (ppxVar4 = (xmlChar **)(*xmlRealloc)(ctxt->nsTab,(ulong)(uint)(iVar11 * 2) << 3),
       ppxVar4 != (xmlChar **)0x0)) {
      ctxt->nsTab = ppxVar4;
      pxVar5 = (xmlParserNsExtra *)(*xmlRealloc)(ctxt->nsdb->extra,uVar8 * 0x18);
      if (pxVar5 != (xmlParserNsExtra *)0x0) {
        ctxt->nsdb->extra = pxVar5;
        ctxt->nsMax = iVar11;
        uri = local_48;
        goto LAB_0013d4c6;
      }
    }
    xmlCtxtErrMemory(ctxt);
    goto LAB_0013d791;
  }
LAB_0013d4c6:
  if ((prefix == (xmlHashedString *)0x0) || (pxVar10 = prefix->name, pxVar10 == (xmlChar *)0x0)) {
    pxVar7 = ctxt->nsdb;
    uVar3 = pxVar7->defaultNsIndex;
    if ((ulong)uVar3 != 0x7fffffff) {
      if (pxVar7->extra[uVar3].elementId == pxVar7->elementId) {
        if (defAttr != 0) {
          return 0;
        }
        msg = "Attribute %s redefined\n";
        pxVar10 = (xmlChar *)0x0;
        goto LAB_0013d84b;
      }
      if (((ctxt->options & 0x2000) != 0) && (uri->name == ctxt->nsTab[(ulong)(uVar3 * 2) + 1])) {
        return 0;
      }
    }
    pxVar7->defaultNsIndex = ctxt->nsNr;
  }
  else {
    uVar3 = xmlParserNsLookup(ctxt,prefix,&bucket);
    if (uVar3 == 0x7fffffff) {
      local_3c = prefix->hashValue;
      uVar3 = ctxt->nsdb->hashSize;
      if (uVar3 >> 1 < ctxt->nsdb->hashElems + 1) {
        if ((int)uVar3 < 0) {
LAB_0013d791:
          xmlCtxtErrMemory(ctxt);
          return -1;
        }
        uVar8 = 0x10;
        if (uVar3 != 0) {
          uVar8 = (ulong)(uVar3 * 2);
        }
        local_38 = uVar8 * 8;
        local_48 = (xmlHashedString *)saxData;
        __s = (xmlParserNsBucket *)(*xmlMalloc)(local_38);
        if (__s == (xmlParserNsBucket *)0x0) goto LAB_0013d791;
        memset(__s,0,local_38);
        pxVar7 = ctxt->nsdb;
        uVar3 = (uint)uVar8;
        if (pxVar7->hashSize != 0) {
          uVar8 = 0;
          do {
            pxVar2 = pxVar7->hash;
            if ((pxVar2[uVar8].hashValue != 0) && (pxVar2[uVar8].index != 0x7fffffff)) {
              uVar9 = pxVar2[uVar8].hashValue & uVar3 - 1;
              while (__s[uVar9].hashValue != 0) {
                uVar9 = uVar9 + 1;
                if (uVar9 == uVar3) {
                  uVar9 = 0;
                }
              }
              __s[uVar9] = pxVar2[uVar8];
            }
            uVar8 = uVar8 + 1;
            pxVar7 = ctxt->nsdb;
          } while (uVar8 < pxVar7->hashSize);
        }
        (*xmlFree)(pxVar7->hash);
        pxVar7 = ctxt->nsdb;
        pxVar7->hash = __s;
        pxVar7->hashSize = uVar3;
        uVar8 = (ulong)(uVar3 - 1 & local_3c);
        if (__s[uVar8].hashValue != 0) {
          do {
            uVar9 = (int)uVar8 + 1;
            uVar8 = (ulong)uVar9;
            if (uVar9 == uVar3) {
              uVar8 = 0;
            }
          } while (__s[uVar8].hashValue != 0);
        }
        bucket = __s + uVar8;
        saxData = local_48;
      }
      bucket->hashValue = local_3c;
      bucket->index = ctxt->nsNr;
      puVar1 = &ctxt->nsdb->hashElems;
      *puVar1 = *puVar1 + 1;
      uVar3 = 0x7fffffff;
    }
    else {
      if (ctxt->nsdb->extra[uVar3].elementId == ctxt->nsdb->elementId) {
        if (defAttr != 0) {
          return 0;
        }
        msg = "Attribute %s:%s redefined\n";
LAB_0013d84b:
        xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ATTRIBUTE_REDEFINED,XML_ERR_FATAL,
                   "xmlns",pxVar10,(xmlChar *)0x0,0,msg,"xmlns");
        return 0;
      }
      if (((ctxt->options & 0x2000) != 0) && (uri->name == ctxt->nsTab[(long)bucket->index * 2 + 1])
         ) {
        return 0;
      }
      bucket->index = ctxt->nsNr;
    }
  }
  uVar9 = ctxt->nsNr;
  uVar6 = 0;
  ppxVar4 = ctxt->nsTab;
  if (prefix == (xmlHashedString *)0x0) {
    pxVar10 = (xmlChar *)0x0;
  }
  else {
    pxVar10 = prefix->name;
  }
  ppxVar4[uVar9 * 2] = pxVar10;
  ppxVar4[(ulong)(uVar9 * 2) + 1] = uri->name;
  pxVar7 = ctxt->nsdb;
  pxVar5 = pxVar7->extra + uVar9;
  pxVar5->saxData = saxData;
  if (prefix != (xmlHashedString *)0x0) {
    uVar6 = prefix->hashValue;
  }
  pxVar5->prefixHashValue = uVar6;
  pxVar5->uriHashValue = uri->hashValue;
  pxVar5->elementId = pxVar7->elementId;
  pxVar5->oldIndex = uVar3;
  ctxt->nsNr = uVar9 + 1;
  return 1;
}

Assistant:

static int
xmlParserNsPush(xmlParserCtxtPtr ctxt, const xmlHashedString *prefix,
                const xmlHashedString *uri, void *saxData, int defAttr) {
    xmlParserNsBucket *bucket = NULL;
    xmlParserNsExtra *extra;
    const xmlChar **ns;
    unsigned hashValue, nsIndex, oldIndex;

    if ((prefix != NULL) && (prefix->name == ctxt->str_xml))
        return(0);

    if ((ctxt->nsNr >= ctxt->nsMax) && (xmlParserNsGrow(ctxt) < 0)) {
        xmlErrMemory(ctxt);
        return(-1);
    }

    /*
     * Default namespace and 'xml' namespace
     */
    if ((prefix == NULL) || (prefix->name == NULL)) {
        oldIndex = ctxt->nsdb->defaultNsIndex;

        if (oldIndex != INT_MAX) {
            extra = &ctxt->nsdb->extra[oldIndex];

            if (extra->elementId == ctxt->nsdb->elementId) {
                if (defAttr == 0)
                    xmlErrAttributeDup(ctxt, NULL, BAD_CAST "xmlns");
                return(0);
            }

            if ((ctxt->options & XML_PARSE_NSCLEAN) &&
                (uri->name == ctxt->nsTab[oldIndex * 2 + 1]))
                return(0);
        }

        ctxt->nsdb->defaultNsIndex = ctxt->nsNr;
        goto populate_entry;
    }

    /*
     * Hash table lookup
     */
    oldIndex = xmlParserNsLookup(ctxt, prefix, &bucket);
    if (oldIndex != INT_MAX) {
        extra = &ctxt->nsdb->extra[oldIndex];

        /*
         * Check for duplicate definitions on the same element.
         */
        if (extra->elementId == ctxt->nsdb->elementId) {
            if (defAttr == 0)
                xmlErrAttributeDup(ctxt, BAD_CAST "xmlns", prefix->name);
            return(0);
        }

        if ((ctxt->options & XML_PARSE_NSCLEAN) &&
            (uri->name == ctxt->nsTab[bucket->index * 2 + 1]))
            return(0);

        bucket->index = ctxt->nsNr;
        goto populate_entry;
    }

    /*
     * Insert new bucket
     */

    hashValue = prefix->hashValue;

    /*
     * Grow hash table, 50% fill factor
     */
    if (ctxt->nsdb->hashElems + 1 > ctxt->nsdb->hashSize / 2) {
        xmlParserNsBucket *newHash;
        unsigned newSize, i, index;

        if (ctxt->nsdb->hashSize > UINT_MAX / 2) {
            xmlErrMemory(ctxt);
            return(-1);
        }
        newSize = ctxt->nsdb->hashSize ? ctxt->nsdb->hashSize * 2 : 16;
        newHash = xmlMalloc(newSize * sizeof(newHash[0]));
        if (newHash == NULL) {
            xmlErrMemory(ctxt);
            return(-1);
        }
        memset(newHash, 0, newSize * sizeof(newHash[0]));

        for (i = 0; i < ctxt->nsdb->hashSize; i++) {
            unsigned hv = ctxt->nsdb->hash[i].hashValue;
            unsigned newIndex;

            if ((hv == 0) || (ctxt->nsdb->hash[i].index == INT_MAX))
                continue;
            newIndex = hv & (newSize - 1);

            while (newHash[newIndex].hashValue != 0) {
                newIndex++;
                if (newIndex == newSize)
                    newIndex = 0;
            }

            newHash[newIndex] = ctxt->nsdb->hash[i];
        }

        xmlFree(ctxt->nsdb->hash);
        ctxt->nsdb->hash = newHash;
        ctxt->nsdb->hashSize = newSize;

        /*
         * Relookup
         */
        index = hashValue & (newSize - 1);

        while (newHash[index].hashValue != 0) {
            index++;
            if (index == newSize)
                index = 0;
        }

        bucket = &newHash[index];
    }

    bucket->hashValue = hashValue;
    bucket->index = ctxt->nsNr;
    ctxt->nsdb->hashElems++;
    oldIndex = INT_MAX;

populate_entry:
    nsIndex = ctxt->nsNr;

    ns = &ctxt->nsTab[nsIndex * 2];
    ns[0] = prefix ? prefix->name : NULL;
    ns[1] = uri->name;

    extra = &ctxt->nsdb->extra[nsIndex];
    extra->saxData = saxData;
    extra->prefixHashValue = prefix ? prefix->hashValue : 0;
    extra->uriHashValue = uri->hashValue;
    extra->elementId = ctxt->nsdb->elementId;
    extra->oldIndex = oldIndex;

    ctxt->nsNr++;

    return(1);
}